

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::LineDirectiveSyntax::setChild
          (LineDirectiveSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c76aac + *(int *)(&DAT_00c76aac + in_RSI * 4)))();
  return;
}

Assistant:

void LineDirectiveSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        case 1: lineNumber = child.token(); return;
        case 2: fileName = child.token(); return;
        case 3: level = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}